

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O1

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyIntPropertyValue
          (UnicodeSet *this,UProperty prop,int32_t value,UErrorCode *ec)

{
  undefined8 in_RAX;
  UCPMap *map;
  UnicodeSet *pUVar1;
  code *filter;
  UScriptCode script;
  int local_18;
  int local_14;
  
  _local_18 = CONCAT44((int)((ulong)in_RAX >> 0x20),value);
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    if (prop == UCHAR_OTHER_PROPERTY_START) {
      pUVar1 = CharacterProperties::getInclusionsForProperty(UCHAR_OTHER_PROPERTY_START,ec);
      _local_18 = CONCAT44(local_18,local_18);
      applyFilter(this,anon_unknown_0::scriptExtensionsFilter,&local_14,pUVar1,ec);
    }
    else {
      if (prop == UCHAR_GENERAL_CATEGORY_MASK) {
        map = u_getIntPropertyMap_63(UCHAR_GENERAL_CATEGORY,ec);
        filter = anon_unknown_0::generalCategoryMaskFilter;
      }
      else {
        if ((uint)prop < 0x41) {
          if (1 < (uint)value) {
            clear(this);
            return this;
          }
          pUVar1 = (UnicodeSet *)u_getBinaryPropertySet_63(prop,ec);
          if (U_ZERO_ERROR < *ec) {
            return this;
          }
          copyFrom(this,pUVar1,'\x01');
          if (local_18 != 0) {
            return this;
          }
          complement(this);
          return this;
        }
        if (0x18 < (uint)(prop + 0xfffff000)) {
          *ec = U_ILLEGAL_ARGUMENT_ERROR;
          return this;
        }
        map = u_getIntPropertyMap_63(prop,ec);
        filter = anon_unknown_0::intValueFilter;
      }
      applyIntPropertyValue(this,map,filter,&local_18,ec);
    }
  }
  return this;
}

Assistant:

UnicodeSet&
UnicodeSet::applyIntPropertyValue(UProperty prop, int32_t value, UErrorCode& ec) {
    if (U_FAILURE(ec)) { return *this; }
    // All of the following check isFrozen() before modifying this set.
    if (prop == UCHAR_GENERAL_CATEGORY_MASK) {
        const UCPMap *map = u_getIntPropertyMap(UCHAR_GENERAL_CATEGORY, &ec);
        applyIntPropertyValue(map, generalCategoryMaskFilter, &value, ec);
    } else if (prop == UCHAR_SCRIPT_EXTENSIONS) {
        const UnicodeSet* inclusions = CharacterProperties::getInclusionsForProperty(prop, ec);
        UScriptCode script = (UScriptCode)value;
        applyFilter(scriptExtensionsFilter, &script, inclusions, ec);
    } else if (0 <= prop && prop < UCHAR_BINARY_LIMIT) {
        if (value == 0 || value == 1) {
            const USet *set = u_getBinaryPropertySet(prop, &ec);
            if (U_FAILURE(ec)) { return *this; }
            copyFrom(*UnicodeSet::fromUSet(set), TRUE);
            if (value == 0) {
                complement();
            }
        } else {
            clear();
        }
    } else if (UCHAR_INT_START <= prop && prop < UCHAR_INT_LIMIT) {
        const UCPMap *map = u_getIntPropertyMap(prop, &ec);
        applyIntPropertyValue(map, intValueFilter, &value, ec);
    } else {
        // This code used to always call getInclusions(property source)
        // which sets an error for an unsupported property.
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        // Otherwise we would just clear() this set because
        // getIntPropertyValue(c, prop) returns 0 for all code points.
    }
    return *this;
}